

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O1

int trie_append(trie dest,trie src)

{
  trie_node_append_iterator_args_type args;
  trie local_20;
  vector local_18;
  
  if (src != (trie)0x0 && dest != (trie)0x0) {
    local_20 = dest;
    local_18 = vector_create(8);
    trie_node_iterate(src,src->root,trie_node_append_cb_iterator,&local_20);
    vector_destroy(local_18);
  }
  return (uint)(src == (trie)0x0 || dest == (trie)0x0);
}

Assistant:

int trie_append(trie dest, trie src)
{
	if (dest != NULL && src != NULL)
	{
		struct trie_node_append_iterator_args_type args;

		args.dest = dest;
		args.prefixes = vector_create(sizeof(trie_key));

		trie_iterate(src, &trie_node_append_cb_iterator, &args);

		vector_destroy(args.prefixes);

		return 0;
	}

	return 1;
}